

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QStyleOptionViewItem::ViewItemPosition>::resize
          (QList<QStyleOptionViewItem::ViewItemPosition> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *in_RSI;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *in_RDI;
  QList<QStyleOptionViewItem::ViewItemPosition> *unaff_retaddr;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QStyleOptionViewItem::ViewItemPosition>::size
                    ((QList<QStyleOptionViewItem::ViewItemPosition> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::operator->(in_RDI);
    QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::appendInitialize
              (this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }